

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckedArithmetic.h
# Opt level: O0

uint Imf_2_5::uiMult<unsigned_int>(uint a,uint b)

{
  uint uVar1;
  OverflowExc *this;
  uint in_ESI;
  uint in_EDI;
  StaticAssertionFailed<true> staticAssertionFailed;
  
  if (in_EDI != 0) {
    uVar1 = std::numeric_limits<unsigned_int>::max();
    if (uVar1 / in_EDI < in_ESI) {
      this = (OverflowExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::OverflowExc::OverflowExc(this,"Integer multiplication overflow.");
      __cxa_throw(this,&Iex_2_5::OverflowExc::typeinfo,Iex_2_5::OverflowExc::~OverflowExc);
    }
  }
  return in_EDI * in_ESI;
}

Assistant:

T
uiMult (T a, T b)
{
    //
    // Unsigned integer multiplication
    //

    IMF_STATIC_ASSERT (!std::numeric_limits<T>::is_signed &&
                        std::numeric_limits<T>::is_integer);

    if (a > 0 && b > std::numeric_limits<T>::max() / a)
        throw IEX_NAMESPACE::OverflowExc ("Integer multiplication overflow.");

    return a * b;
}